

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

Reader __thiscall
capnp::_::PointerReader::getBlob<capnp::Data>
          (PointerReader *this,void *defaultValue,ByteCount defaultSize)

{
  WirePointer *pWVar1;
  word *pwVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar6;
  ByteCount BVar7;
  ulong uVar8;
  ulong uVar9;
  WirePointer *pWVar10;
  long lVar11;
  ulong uVar12;
  WirePointer *pWVar13;
  WirePointer *pWVar14;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *this_00;
  WirePointer *pWVar15;
  bool bVar16;
  Reader RVar17;
  SegmentReader *local_68;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  SegmentReader *newSegment;
  Fault f_2;
  
  pWVar14 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar14 = this->pointer;
  }
  if (0x1fffffff < defaultSize) {
    kj::ThrowOverflow::operator()((ThrowOverflow *)&_kjCondition);
  }
  local_68 = this->segment;
  uVar5 = (pWVar14->offsetAndKind).value;
  pWVar10 = (WirePointer *)defaultValue;
  BVar7 = defaultSize;
  if (local_68 == (SegmentReader *)0x0) {
    local_68 = (SegmentReader *)0x0;
    if ((pWVar14->field_1).upper32Bits == 0 && uVar5 == 0) goto LAB_0018a398;
    pWVar10 = pWVar14 + (long)((int)uVar5 >> 2) + 1;
LAB_0018a24f:
    uVar5 = uVar5 & 3;
    _kjCondition.left = (SegmentReader **)CONCAT44(1,uVar5);
    _kjCondition.right = anon_var_dwarf_48971;
    _kjCondition.op.content.ptr = (char *)0x5;
    _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar5 == 1);
    if (uVar5 == 1) {
      _kjCondition.left =
           (SegmentReader **)
           (CONCAT71(_kjCondition.left._1_7_,*(byte *)&pWVar14->field_1) & 0xffffffffffffff07);
      _kjCondition.left._0_2_ = CONCAT11(2,_kjCondition.left._0_1_);
      _kjCondition.right = anon_var_dwarf_48971;
      _kjCondition.op.content.ptr = (char *)0x5;
      bVar16 = (*(byte *)&pWVar14->field_1 & 7) == 2;
      _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar16);
      if (bVar16) {
        BVar7 = (pWVar14->field_1).upper32Bits >> 3;
        if (local_68 == (SegmentReader *)0x0) goto LAB_0018a398;
        uVar9 = (ulong)(BVar7 + 7 >> 3);
        if (((long)pWVar10 - (long)(local_68->ptr).ptr >> 3) + uVar9 <= (local_68->ptr).size_) {
          uVar12 = local_68->readLimiter->limit;
          if (uVar9 <= uVar12) {
            local_68->readLimiter->limit = uVar12 - uVar9;
            goto LAB_0018a398;
          }
          (*local_68->arena->_vptr_Arena[3])();
        }
        newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
        this_00 = &_kjCondition;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x9e8,FAILED,"boundsCheck(segment, ptr, roundBytesUpToWords(size))",
                   "_kjCondition,\"Message contained out-of-bounds data pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&newSegment,
                   (char (*) [320])
                   "Message contained out-of-bounds data pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
      }
      else {
        this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[85]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x9e2,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                   "_kjCondition,\"Schema mismatch: Message contains list pointer of non-bytes where data was \" \"expected.\""
                   ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)&_kjCondition,
                   (char (*) [85])
                   "Schema mismatch: Message contains list pointer of non-bytes where data was expected."
                  );
      }
    }
    else {
      this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[76]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x9dc,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Message contains non-list pointer where data was expected.\""
                 ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                  &_kjCondition,
                 (char (*) [76])
                 "Schema mismatch: Message contains non-list pointer where data was expected.");
    }
  }
  else {
    pwVar2 = (local_68->ptr).ptr;
    if ((pWVar14->field_1).upper32Bits == 0 && uVar5 == 0) goto LAB_0018a398;
    pWVar13 = (WirePointer *)(pwVar2 + (local_68->ptr).size_);
    lVar11 = (long)((int)uVar5 >> 2);
    pWVar15 = pWVar14 + lVar11 + 1;
    if ((long)pWVar13 - (long)(pWVar14 + 1) >> 3 < lVar11) {
      pWVar15 = pWVar13;
    }
    if (lVar11 < (long)pwVar2 - (long)(pWVar14 + 1) >> 3) {
      pWVar15 = pWVar13;
    }
    if ((uVar5 & 3) != 2) {
LAB_0018a243:
      if (pWVar15 == (WirePointer *)0x0) goto LAB_0018a398;
      uVar5 = (pWVar14->offsetAndKind).value;
      pWVar10 = pWVar15;
      goto LAB_0018a24f;
    }
    iVar4 = (*local_68->arena->_vptr_Arena[2])();
    local_68 = (SegmentReader *)CONCAT44(extraout_var,iVar4);
    _kjCondition.right = (void *)0x0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_68 != (SegmentReader *)0x0;
    if (local_68 == (SegmentReader *)0x0) {
      this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      _kjCondition.left = &local_68;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
    }
    else {
      uVar5 = (pWVar14->offsetAndKind).value;
      uVar12 = (ulong)(uVar5 >> 3);
      uVar9 = (local_68->ptr).size_;
      if ((long)uVar9 < (long)uVar12) {
        uVar12 = uVar9;
      }
      uVar8 = 2 - (ulong)((uVar5 & 4) == 0);
      _kjCondition.left = &local_68;
      if (uVar12 + uVar8 <= uVar9) {
        pWVar13 = (WirePointer *)((local_68->ptr).ptr + uVar12);
        uVar9 = local_68->readLimiter->limit;
        if (uVar8 <= uVar9) {
          local_68->readLimiter->limit = uVar9 - uVar8;
          if (((pWVar14->offsetAndKind).value & 4) == 0) {
            pWVar1 = pWVar13 + 1;
            uVar5 = (pWVar13->offsetAndKind).value;
            lVar11 = (long)((int)uVar5 >> 2);
            pWVar14 = pWVar13;
            if ((local_68 == (SegmentReader *)0x0) ||
               ((pwVar2 = (local_68->ptr).ptr,
                pWVar15 = (WirePointer *)(pwVar2 + (local_68->ptr).size_),
                (long)pwVar2 - (long)pWVar1 >> 3 <= lVar11 &&
                (lVar11 <= (long)pWVar15 - (long)pWVar1 >> 3)))) {
              pWVar10 = pWVar1 + lVar11;
              goto LAB_0018a24f;
            }
            goto LAB_0018a243;
          }
          _kjCondition.left = &local_68;
          iVar4 = (*local_68->arena->_vptr_Arena[2])
                            (local_68->arena,(ulong)(pWVar13->field_1).upper32Bits);
          newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar4);
          _kjCondition.left = &newSegment;
          _kjCondition.right = (void *)0x0;
          _kjCondition.op.content.ptr = " != ";
          _kjCondition.op.content.size_ = 5;
          _kjCondition.result = newSegment != (SegmentReader *)0x0;
          if (newSegment == (SegmentReader *)0x0) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                      (&f_2,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x25f,FAILED,"newSegment != nullptr",
                       "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                       &_kjCondition,
                       (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_0018a230:
            pWVar15 = (WirePointer *)0x0;
            kj::_::Debug::Fault::~Fault(&f_2);
          }
          else {
            uVar5 = (pWVar13->offsetAndKind).value;
            uVar6 = uVar5 & 3;
            _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar6);
            _kjCondition.right = anon_var_dwarf_48971;
            _kjCondition.op.content.ptr = (char *)0x5;
            _kjCondition.op.content.size_ = (size_t)(uVar6 == 2);
            if (uVar6 != 2) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                        (&f_2,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                         "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                         (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                          *)&_kjCondition,
                         (char (*) [51])"Second word of double-far pad must be far pointer.");
              goto LAB_0018a230;
            }
            uVar9 = (ulong)(uVar5 >> 3);
            sVar3 = (newSegment->ptr).size_;
            if ((long)sVar3 < (long)uVar9) {
              uVar9 = sVar3;
            }
            pWVar15 = (WirePointer *)((newSegment->ptr).ptr + uVar9);
            local_68 = newSegment;
          }
          pWVar14 = pWVar13 + 1;
          goto LAB_0018a243;
        }
        _kjCondition.left = &local_68;
        (*local_68->arena->_vptr_Arena[3])();
      }
      newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
      this_00 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&newSegment,
                 (char (*) [318])
                 "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
    }
  }
  kj::_::Debug::Fault::~Fault((Fault *)this_00);
  pWVar10 = (WirePointer *)defaultValue;
  BVar7 = defaultSize;
LAB_0018a398:
  RVar17.super_ArrayPtr<const_unsigned_char>.size_._0_4_ = BVar7;
  RVar17.super_ArrayPtr<const_unsigned_char>.ptr = (uchar *)pWVar10;
  RVar17.super_ArrayPtr<const_unsigned_char>.size_._4_4_ = 0;
  return (Reader)RVar17.super_ArrayPtr<const_unsigned_char>;
}

Assistant:

Data::Reader PointerReader::getBlob<Data>(const void* defaultValue, ByteCount defaultSize) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readDataPointer(segment, ref, defaultValue,
      assertMaxBits<BLOB_SIZE_BITS>(defaultSize, ThrowOverflow()));
}